

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O3

void highs::parallel::for_each<HEkkDual::majorChooseRowBtran()::__0&>
               (HighsInt start,HighsInt end,anon_class_40_5_3855c632 *f,HighsInt grainSize)

{
  __atomic_base<int> _Var1;
  element_type *peVar2;
  HEkkDual *pHVar3;
  HVectorBase<double> *pHVar4;
  HighsSplitDeque *pHVar5;
  uint uVar6;
  long *plVar7;
  ulong uVar8;
  HighsTimerClock *pHVar9;
  uint32_t uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  double dVar14;
  TaskGroup tg;
  TaskGroup local_40;
  
  iVar12 = end - start;
  if (grainSize < iVar12) {
    HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
    plVar7 = (long *)__tls_get_addr(&PTR_00441ef0);
    local_40.workerDeque = (HighsSplitDeque *)*plVar7;
    local_40.dequeHead = ((local_40.workerDeque)->ownerData).head;
    do {
      pHVar5 = local_40.workerDeque;
      iVar12 = start + end >> 1;
      uVar6 = ((local_40.workerDeque)->ownerData).head;
      uVar8 = (ulong)uVar6;
      if (uVar8 < 0x2000) {
        uVar10 = (uint32_t)(uVar8 + 1);
        ((local_40.workerDeque)->ownerData).head = uVar10;
        ((local_40.workerDeque)->taskArray)._M_elems[uVar8].metadata.stealer.
        super___atomic_base<unsigned_long>._M_i = 0;
        *(undefined ***)((local_40.workerDeque)->taskArray)._M_elems[uVar8].taskData =
             &PTR_operator___00441448;
        *(int *)(((local_40.workerDeque)->taskArray)._M_elems[uVar8].taskData + 8) = iVar12;
        *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar8].taskData + 0xc) = end;
        *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar8].taskData + 0x10) =
             grainSize;
        *(anon_class_40_5_3855c632 **)
         (((local_40.workerDeque)->taskArray)._M_elems[uVar8].taskData + 0x18) = f;
        if (((local_40.workerDeque)->ownerData).allStolenCopy == true) {
          ((local_40.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
               uVar8 << 0x20 | uVar8 + 1;
          ((local_40.workerDeque)->stealerData).allStolen._M_base._M_i = false;
          ((local_40.workerDeque)->ownerData).splitCopy = uVar10;
          ((local_40.workerDeque)->ownerData).allStolenCopy = false;
          if ((((local_40.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
            ((local_40.workerDeque)->splitRequest)._M_base._M_i = false;
          }
          peVar2 = ((local_40.workerDeque)->ownerData).workerBunk.
                   super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          LOCK();
          _Var1._M_i = (peVar2->haveJobs).super___atomic_base<int>._M_i;
          (peVar2->haveJobs).super___atomic_base<int>._M_i =
               (peVar2->haveJobs).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          if (_Var1._M_i < ((local_40.workerDeque)->ownerData).numWorkers + -1) {
            HighsSplitDeque::WorkerBunk::publishWork
                      (((local_40.workerDeque)->ownerData).workerBunk.
                       super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,local_40.workerDeque);
          }
        }
        else {
          HighsSplitDeque::growShared(local_40.workerDeque);
        }
      }
      else {
        if ((((local_40.workerDeque)->ownerData).splitCopy < 0x2000) &&
           (((local_40.workerDeque)->ownerData).allStolenCopy == false)) {
          HighsSplitDeque::growShared(local_40.workerDeque);
          uVar6 = (pHVar5->ownerData).head;
        }
        (pHVar5->ownerData).head = uVar6 + 1;
        for_each<HEkkDual::majorChooseRowBtran()::__0&>(iVar12,end,f,grainSize);
      }
      end = iVar12;
    } while (grainSize < iVar12 - start);
    iVar11 = iVar12 - start;
    if (iVar11 != 0 && start <= iVar12) {
      pHVar3 = f->this;
      lVar13 = (long)start;
      do {
        iVar12 = (*f->multi_iRow)[lVar13];
        pHVar4 = (*f->multi_vector)[lVar13];
        HVectorBase<double>::clear(pHVar4);
        pHVar4->count = 1;
        *(pHVar4->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start = iVar12;
        (pHVar4->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar12] = 1.0;
        pHVar4->packFlag = true;
        pHVar9 = HighsSimplexAnalysis::getThreadFactorTimerClockPointer(pHVar3->analysis);
        HSimplexNla::btran(&pHVar3->ekk_instance_->simplex_nla_,pHVar4,
                           (pHVar3->ekk_instance_->info_).row_ep_density,pHVar9);
        if (pHVar3->edge_weight_mode == kSteepestEdge) {
          dVar14 = HVectorBase<double>::norm2(pHVar4);
        }
        else {
          dVar14 = (f->edge_weight->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[iVar12];
        }
        (*f->multi_EdWt)[lVar13] = dVar14;
        lVar13 = lVar13 + 1;
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    TaskGroup::taskWait(&local_40);
    TaskGroup::~TaskGroup(&local_40);
  }
  else if (start < end) {
    pHVar3 = f->this;
    lVar13 = (long)start;
    do {
      iVar11 = (*f->multi_iRow)[lVar13];
      pHVar4 = (*f->multi_vector)[lVar13];
      HVectorBase<double>::clear(pHVar4);
      pHVar4->count = 1;
      *(pHVar4->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start = iVar11;
      (pHVar4->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[iVar11] = 1.0;
      pHVar4->packFlag = true;
      pHVar9 = HighsSimplexAnalysis::getThreadFactorTimerClockPointer(pHVar3->analysis);
      HSimplexNla::btran(&pHVar3->ekk_instance_->simplex_nla_,pHVar4,
                         (pHVar3->ekk_instance_->info_).row_ep_density,pHVar9);
      if (pHVar3->edge_weight_mode == kSteepestEdge) {
        dVar14 = HVectorBase<double>::norm2(pHVar4);
      }
      else {
        dVar14 = (f->edge_weight->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar11];
      }
      (*f->multi_EdWt)[lVar13] = dVar14;
      lVar13 = lVar13 + 1;
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  return;
}

Assistant:

void for_each(HighsInt start, HighsInt end, F&& f, HighsInt grainSize = 1) {
  if (end - start <= grainSize) {
    f(start, end);
  } else {
    TaskGroup tg;

    do {
      HighsInt split = (start + end) >> 1;
      tg.spawn([split, end, grainSize, &f]() {
        for_each(split, end, f, grainSize);
      });
      end = split;
    } while (end - start > grainSize);

    f(start, end);
    tg.taskWait();
  }
}